

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::CreateBuffer::logPrepare
          (CreateBuffer *this,TestLog *log,size_t commandIndex)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  Bitfield<32UL> local_1d0;
  Bitfield<32UL> local_1b8;
  undefined1 local_198 [384];
  char *__s;
  
  this_00 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
  iVar1 = (*(this->super_Command)._vptr_Command[2])(this);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_198._8_8_ + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," Create buffer, Sharing mode: ",0x1e);
  local_1b8.m_value = (deUint64)::vk::getSharingModeName;
  local_1b8.m_begin = (BitDesc *)CONCAT44(local_1b8.m_begin._4_4_,this->m_sharing);
  tcu::Format::Enum<vk::VkSharingMode,_4UL>::toStream
            ((Enum<vk::VkSharingMode,_4UL> *)&local_1b8,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", Usage: ",9);
  ::vk::getBufferUsageFlagsStr(&local_1d0,this->m_usage);
  local_1b8.m_end = local_1d0.m_end;
  local_1b8.m_value = local_1d0.m_value;
  local_1b8.m_begin = local_1d0.m_begin;
  tcu::Format::Bitfield<32UL>::toStream(&local_1b8,(ostream *)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  return;
}

Assistant:

void CreateBuffer::logPrepare (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName() << " Create buffer, Sharing mode: " << m_sharing << ", Usage: " << vk::getBufferUsageFlagsStr(m_usage) << TestLog::EndMessage;
}